

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O1

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::ScreenGeometryEvent,QScreen*,QRect,QRect>
               (QScreen *args,QRect args_1,QRect args_2)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  undefined1 uVar4;
  long in_FS_OFFSET;
  WindowSystemEvent local_88;
  int *piStack_70;
  QScreen *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QThread::isMainThread();
  if (cVar1 == '\0') {
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::ScreenGeometryEvent,QScreen*,QRect,QRect>
              (args,args_1,args_2);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      bVar2 = QWindowSystemInterface::flushWindowSystemEvents((ProcessEventsFlags)0x0);
      return bVar2;
    }
    goto LAB_00333fbd;
  }
  local_88._20_4_ = 0xaaaaaaaa;
  piStack_70 = (int *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = (QScreen *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_88.type = ScreenGeometry;
  local_88.flags = 0;
  local_88.eventAccepted = true;
  local_88._17_3_ = 0xaaaaaa;
  local_88._vptr_WindowSystemEvent = (_func_int **)&PTR__ScreenGeometryEvent_007ea060;
  if (args == (QScreen *)0x0) {
    piStack_70 = (int *)0x0;
  }
  else {
    piStack_70 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&args->super_QObject);
  }
  local_68 = args;
  puStack_60 = (undefined1 *)args_1._0_8_;
  local_58 = (undefined1 *)args_1._8_8_;
  puStack_50 = (undefined1 *)args_2._0_8_;
  local_48 = (undefined1 *)args_2._8_8_;
  if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
    QGuiApplicationPrivate::processWindowSystemEvent(&local_88);
LAB_00333f76:
    uVar4 = local_88.eventAccepted;
  }
  else {
    iVar3 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                      (QWindowSystemInterfacePrivate::eventHandler,&local_88);
    if ((char)iVar3 != '\0') goto LAB_00333f76;
    uVar4 = 0;
  }
  local_88._vptr_WindowSystemEvent = (_func_int **)&PTR__ScreenGeometryEvent_007ea060;
  if (piStack_70 != (int *)0x0) {
    LOCK();
    *piStack_70 = *piStack_70 + -1;
    UNLOCK();
    if ((*piStack_70 == 0) && (piStack_70 != (int *)0x0)) {
      operator_delete(piStack_70);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar4;
  }
LAB_00333fbd:
  __stack_chk_fail();
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}